

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::VSliderScalar
               (char *label,ImVec2 *size,ImGuiDataType data_type,void *p_data,void *p_min,
               void *p_max,char *format,ImGuiSliderFlags flags)

{
  ImDrawList *this;
  ImVec2 p_min_00;
  ImVec2 p_max_00;
  ImGuiContext *pIVar1;
  char *text_end;
  bool bVar2;
  ImGuiID id_00;
  ImU32 IVar3;
  int iVar4;
  ImGuiWindow *this_00;
  ImGuiDataTypeInfo *pIVar5;
  ImGuiCol idx;
  ImGuiCol local_16c;
  float local_15c;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  char *local_120;
  char *value_buf_end;
  char value_buf [64];
  undefined1 local_c8 [7];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool hovered;
  ImVec2 local_94;
  undefined1 local_8c [8];
  ImRect bb;
  undefined1 local_74 [8];
  ImRect frame_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  void *p_max_local;
  void *p_min_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  ImVec2 *size_local;
  char *label_local;
  
  this_00 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((this_00->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this_00,label,(char *)0x0);
    frame_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    bb.Max = operator+(&(this_00->DC).CursorPos,size);
    ImRect::ImRect((ImRect *)local_74,&(this_00->DC).CursorPos,&bb.Max);
    if (frame_bb.Max.x <= 0.0) {
      local_15c = 0.0;
    }
    else {
      local_15c = (pIVar1->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    }
    ImVec2::ImVec2((ImVec2 *)&frame_col,local_15c,0.0);
    local_94 = operator+(&frame_bb.Min,(ImVec2 *)&frame_col);
    ImRect::ImRect((ImRect *)local_8c,(ImVec2 *)local_74,&local_94);
    ItemSize((ImRect *)local_8c,(pIVar1->Style).FramePadding.y);
    bVar2 = ItemAdd((ImRect *)local_74,id_00,(ImRect *)0x0,0);
    if (bVar2) {
      if (format == (char *)0x0) {
        pIVar5 = DataTypeGetInfo(data_type);
        format = pIVar5->PrintFmt;
      }
      else if ((data_type == 4) && (iVar4 = strcmp(format,"%d"), iVar4 != 0)) {
        format = PatchFormatStringFloatToInt(format);
      }
      bVar2 = ItemHoverable((ImRect *)local_74,id_00);
      if ((((bVar2) && (((pIVar1->IO).MouseClicked[0] & 1U) != 0)) ||
          (pIVar1->NavActivateId == id_00)) || (pIVar1->NavInputId == id_00)) {
        SetActiveID(id_00,this_00);
        SetFocusID(id_00,this_00);
        FocusWindow(this_00);
        pIVar1->ActiveIdUsingNavDirMask = pIVar1->ActiveIdUsingNavDirMask | 0xc;
      }
      if (pIVar1->ActiveId == id_00) {
        local_16c = 9;
      }
      else {
        local_16c = 7;
        if (pIVar1->HoveredId == id_00) {
          local_16c = 8;
        }
      }
      IVar3 = GetColorU32(local_16c,1.0);
      RenderNavHighlight((ImRect *)local_74,id_00,1);
      p_min_00.y = (float)local_74._4_4_;
      p_min_00.x = (float)local_74._0_4_;
      p_max_00.y = frame_bb.Min.y;
      p_max_00.x = frame_bb.Min.x;
      RenderFrame(p_min_00,p_max_00,IVar3,true,(pIVar1->Style).FrameRounding);
      ImRect::ImRect((ImRect *)local_c8);
      label_local._7_1_ =
           SliderBehavior((ImRect *)local_74,id_00,data_type,p_data,p_min,p_max,format,
                          flags | 0x100000,(ImRect *)local_c8);
      if (label_local._7_1_) {
        MarkItemEdited(id_00);
      }
      if (stack0xffffffffffffff3c < grab_bb.Min.y) {
        this = this_00->DrawList;
        idx = 0x13;
        if (pIVar1->ActiveId == id_00) {
          idx = 0x14;
        }
        IVar3 = GetColorU32(idx,1.0);
        ImDrawList::AddRectFilled
                  (this,(ImVec2 *)local_c8,&grab_bb.Min,IVar3,(pIVar1->Style).GrabRounding,0);
      }
      iVar4 = DataTypeFormatString((char *)&value_buf_end,0x40,data_type,p_data,format);
      local_120 = value_buf + (long)iVar4 + -8;
      ImVec2::ImVec2(&local_128,(float)local_74._0_4_,
                     (float)local_74._4_4_ + (pIVar1->Style).FramePadding.y);
      text_end = local_120;
      ImVec2::ImVec2(&local_130,0.5,0.0);
      RenderTextClipped(&local_128,&frame_bb.Min,(char *)&value_buf_end,text_end,(ImVec2 *)0x0,
                        &local_130,(ImRect *)0x0);
      if (0.0 < frame_bb.Max.x) {
        ImVec2::ImVec2(&local_138,frame_bb.Min.x + (pIVar1->Style).ItemInnerSpacing.x,
                       (float)local_74._4_4_ + (pIVar1->Style).FramePadding.y);
        RenderText(local_138,label,(char *)0x0,true);
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::VSliderScalar(const char* label, const ImVec2& size, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(frame_bb, id))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    const bool hovered = ItemHoverable(frame_bb, id);
    if ((hovered && g.IO.MouseClicked[0]) || g.NavActivateId == id || g.NavInputId == id)
    {
        SetActiveID(id, window);
        SetFocusID(id, window);
        FocusWindow(window);
        g.ActiveIdUsingNavDirMask |= (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, p_data, p_min, p_max, format, flags | ImGuiSliderFlags_Vertical, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.y > grab_bb.Min.y)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    // For the vertical slider we allow centered text to overlap the frame padding
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    return value_changed;
}